

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.h
# Opt level: O3

int depspawn::internal::
    fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(double(&)[1500],double_const(&)[1500][6000],double_const(&)[6000]),boost::add_reference<mpl_::arg<_1>>>,1l>,double_const(&)[1500][6000],double(&)[6000]>
              (arg_info **args,double (*h) [1500] [6000],double (*t) [6000])

{
  arg_info *paVar1;
  
  paVar1 = LinkedListPool<depspawn::internal::arg_info,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::arg_info,_true,_false> *)arg_info::Pool);
  paVar1->size = 72000000;
  paVar1->wr = false;
  paVar1->rank = '\0';
  paVar1->addr = (value_t)h;
  paVar1->array_range = (array_range_t *)0x0;
  paVar1->next = (arg_info *)0x0;
  arg_info::insert_in_arglist(paVar1,args);
  paVar1 = LinkedListPool<depspawn::internal::arg_info,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::arg_info,_true,_false> *)arg_info::Pool);
  paVar1->size = 48000;
  paVar1->wr = false;
  paVar1->rank = '\0';
  paVar1->addr = (value_t)t;
  paVar1->array_range = (array_range_t *)0x0;
  paVar1->next = (arg_info *)0x0;
  arg_info::insert_in_arglist(paVar1,args);
  return 2;
}

Assistant:

int fill_args(arg_info*& args, Head&& h, Tail&&... t) {
      typedef typename boost::mpl::deref<T_it>::type curr_t;    //Formal parameter type
      constexpr bool is_reference = std::is_reference<curr_t>::value;
      typedef typename std::remove_reference<curr_t>::type deref_t;
      constexpr bool is_const = std::is_const<deref_t>::value;
      constexpr bool is_writable = is_reference && !is_const;
      constexpr bool is_barray = is_blitz_array<typename std::remove_const<typename std::remove_reference<Head>::type>::type>::value;
      constexpr int process_argument =
      !is_ignored<curr_t&&>::value &&
      !is_ignored<Head&&>::value &&
      !(std::is_rvalue_reference<Head&&>::value && !is_barray);
      
      if(process_argument) {
	
        arg_info* n = arg_info::Pool.malloc();
	n->size = sizeof(Head);
	n->wr = is_writable;
	n->next = nullptr;
	n->fill_in_array(h);
	
	// Insert new_arg (n) in order
	n->insert_in_arglist(args);
      }
      
      return process_argument + fill_args<typename boost::mpl::next<T_it>::type>(args, std::forward<Tail>(t)...);
    }